

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DebugNodeWindowsListByBeginStackParent
               (ImGuiWindow **windows,int windows_size,ImGuiWindow *parent_in_begin_stack)

{
  ImGuiWindow *pIVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  ImGuiContext *g;
  ulong uVar4;
  ImGuiWindow **windows_00;
  float fVar5;
  char buf [20];
  char acStack_48 [24];
  
  if (0 < windows_size) {
    uVar4 = (ulong)(uint)windows_size;
    windows_00 = windows + 1;
    do {
      pIVar1 = windows_00[-1];
      if (pIVar1->ParentWindowInBeginStack == parent_in_begin_stack) {
        ImFormatString(acStack_48,0x14,"[%04d] Window",
                       (ulong)(uint)(int)pIVar1->BeginOrderWithinContext);
        DebugNodeWindow(pIVar1,acStack_48);
        pIVar3 = GImGui;
        pIVar2 = GImGui->CurrentWindow;
        pIVar2->WriteAccessed = true;
        fVar5 = (pIVar3->Style).IndentSpacing + (pIVar2->DC).Indent.x;
        (pIVar2->DC).Indent.x = fVar5;
        (pIVar2->DC).CursorPos.x = fVar5 + (pIVar2->Pos).x + (pIVar2->DC).ColumnsOffset.x;
        DebugNodeWindowsListByBeginStackParent(windows_00,(int)uVar4 + -1,pIVar1);
        pIVar3 = GImGui;
        pIVar1 = GImGui->CurrentWindow;
        pIVar1->WriteAccessed = true;
        fVar5 = (pIVar1->DC).Indent.x - (pIVar3->Style).IndentSpacing;
        (pIVar1->DC).Indent.x = fVar5;
        (pIVar1->DC).CursorPos.x = fVar5 + (pIVar1->Pos).x + (pIVar1->DC).ColumnsOffset.x;
      }
      windows_00 = windows_00 + 1;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  return;
}

Assistant:

void ImGui::DebugNodeWindowsListByBeginStackParent(ImGuiWindow** windows, int windows_size, ImGuiWindow* parent_in_begin_stack)
{
    for (int i = 0; i < windows_size; i++)
    {
        ImGuiWindow* window = windows[i];
        if (window->ParentWindowInBeginStack != parent_in_begin_stack)
            continue;
        char buf[20];
        ImFormatString(buf, IM_ARRAYSIZE(buf), "[%04d] Window", window->BeginOrderWithinContext);
        //BulletText("[%04d] Window '%s'", window->BeginOrderWithinContext, window->Name);
        DebugNodeWindow(window, buf);
        Indent();
        DebugNodeWindowsListByBeginStackParent(windows + i + 1, windows_size - i - 1, window);
        Unindent();
    }
}